

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::gift(Company *this)

{
  Employee *this_00;
  int iVar1;
  string *psVar2;
  char *pcVar3;
  int local_14;
  int i;
  Company *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployee(this->boss);
    if (iVar1 <= local_14) break;
    psVar2 = Person::getId_abi_cxx11_(&this->employee[local_14]->super_Person);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psVar2);
    if (*pcVar3 == '8') {
      this_00 = this->employee[local_14];
      iVar1 = Employee::getHourWork(this->employee[local_14]);
      Employee::setHourWork(this_00,iVar1 + 5);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Company::gift() {

    int i = 0;
    while(i < boss->getNumberOfEmployee())
    {
        if (employee[i]->getId()[0] == '8'){
            employee[i]->setHourWork((5 + employee[i]->getHourWork()));
        }
        i++;
    }
}